

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

NFAState * new_NFAState(LexState *ls)

{
  uint uVar1;
  uint uVar2;
  NFAState *__s;
  NFAState *n;
  LexState *ls_local;
  
  __s = (NFAState *)malloc(0x2880);
  memset(__s,0,0x2880);
  uVar1 = ls->nfa_index;
  ls->nfa_index = uVar1 + 1;
  __s->index = uVar1;
  if ((ls->allnfas).v == (NFAState **)0x0) {
    (ls->allnfas).v = (ls->allnfas).e;
    uVar2 = (ls->allnfas).n;
    (ls->allnfas).n = uVar2 + 1;
    (ls->allnfas).e[uVar2] = __s;
  }
  else {
    if ((ls->allnfas).v == (ls->allnfas).e) {
      if ((ls->allnfas).n < 3) {
        uVar2 = (ls->allnfas).n;
        (ls->allnfas).n = uVar2 + 1;
        (ls->allnfas).v[uVar2] = __s;
        return __s;
      }
    }
    else if (((ls->allnfas).n & 7) != 0) {
      uVar2 = (ls->allnfas).n;
      (ls->allnfas).n = uVar2 + 1;
      (ls->allnfas).v[uVar2] = __s;
      return __s;
    }
    vec_add_internal(&ls->allnfas,__s);
  }
  return __s;
}

Assistant:

static NFAState *new_NFAState(LexState *ls) {
  NFAState *n = MALLOC(sizeof(NFAState));
  memset(n, 0, sizeof(NFAState));
  n->index = ls->nfa_index++;
  vec_add(&ls->allnfas, n);
  return n;
}